

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_4cf1ce::HandleIsRelativeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  bool value;
  allocator<char> local_89;
  path local_88;
  string inputPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"IS_RELATIVE must be called with two arguments.",
               (allocator<char> *)&inputPath);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_88);
    return false;
  }
  inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
  inputPath._M_string_length = 0;
  inputPath.field_2._M_local_buf[0] = '\0';
  bVar2 = getInputPath(pbVar1 + 1,status,&inputPath);
  if (bVar2) {
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_40,(string *)&inputPath);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&local_88,&local_40,generic_format);
      value = std::filesystem::__cxx11::path::is_relative(&local_88);
      std::filesystem::__cxx11::path::~path(&local_88);
      std::__cxx11::string::~string((string *)&local_40);
      bVar2 = true;
      cmMakefile::AddDefinitionBool
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,value);
      goto LAB_00201c0e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Invalid name for output variable.",&local_89);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar2 = false;
LAB_00201c0e:
  std::__cxx11::string::~string((string *)&inputPath);
  return bVar2;
}

Assistant:

bool HandleIsRelativeCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("IS_RELATIVE must be called with two arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  bool isRelative = cmCMakePath(inputPath).IsRelative();

  status.GetMakefile().AddDefinitionBool(args[2], isRelative);

  return true;
}